

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

_Bool sysbvm_string_equals(sysbvm_tuple_t a,sysbvm_tuple_t b)

{
  int iVar1;
  _Bool _Var2;
  
  _Var2 = true;
  if (a != b) {
    if ((((a & 0xf) != 0 || a == 0) || ((b & 0xf) != 0 || b == 0)) ||
       (*(uint *)(a + 0xc) != *(uint *)(b + 0xc))) {
      return false;
    }
    iVar1 = bcmp((void *)(a + 0x10),(void *)(b + 0x10),(ulong)*(uint *)(a + 0xc));
    _Var2 = iVar1 == 0;
  }
  return _Var2;
}

Assistant:

SYSBVM_API bool sysbvm_string_equals(sysbvm_tuple_t a, sysbvm_tuple_t b)
{
    if(a == b)
        return true;

    if(!sysbvm_tuple_isNonNullPointer(a) || !sysbvm_tuple_isNonNullPointer(b))
        return false;

    size_t firstSize = sysbvm_tuple_getSizeInBytes(a);
    size_t secondSize = sysbvm_tuple_getSizeInBytes(b);
    if(firstSize != secondSize)
        return false;

    uint8_t *firstBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(a)->bytes;
    uint8_t *secondBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(b)->bytes;
    return memcmp(firstBytes, secondBytes, firstSize) == 0;
}